

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_storage.cpp
# Opt level: O1

int __thiscall
libtorrent::dht::anon_unknown_0::dht_default_storage::get_infohashes_sample
          (dht_default_storage *this,entry *item)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *__args;
  pointer *ppdVar2;
  pointer pdVar3;
  iterator __position;
  pointer pdVar4;
  uint uVar5;
  _Base_ptr p_Var6;
  size_t sVar7;
  undefined4 uVar8;
  uint uVar9;
  entry *peVar10;
  time_point tVar11;
  long lVar12;
  _Base_ptr p_Var13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  ulong v;
  string_view key;
  string_view key_00;
  string_view key_01;
  span<const_char> v_00;
  
  uVar15 = this->m_settings->sample_infohashes_interval;
  if (0x545f < (int)uVar15) {
    uVar15 = 0x5460;
  }
  v = (ulong)uVar15;
  if ((int)uVar15 < 1) {
    v = 0;
  }
  key.len_ = 8;
  key.ptr_ = "interval";
  peVar10 = entry::operator[](item,key);
  entry::operator=(peVar10,v);
  sVar7 = (this->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  key_00.len_ = 3;
  key_00.ptr_ = "num";
  peVar10 = entry::operator[](item,key_00);
  entry::operator=(peVar10,(long)(int)sVar7);
  tVar11 = aux::time_now();
  uVar15 = this->m_settings->sample_infohashes_interval;
  uVar16 = this->m_settings->max_infohashes_sample_count;
  uVar9 = 0x14;
  if ((int)uVar16 < 0x14) {
    uVar9 = uVar16;
  }
  if ((int)uVar9 < 1) {
    uVar9 = 0;
  }
  uVar16 = (uint)(this->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if ((int)uVar9 < (int)uVar16) {
    uVar16 = uVar9;
  }
  if (0 < (int)uVar15) {
    uVar5 = 0x5460;
    if ((int)uVar15 < 0x5460) {
      uVar5 = uVar15;
    }
    if (((long)tVar11.__d.__r <
         (long)((ulong)uVar5 * 1000000000 + (this->m_infohashes_sample).created.__d.__r)) &&
       ((int)uVar9 <=
        (int)((ulong)((long)(this->m_infohashes_sample).samples.
                            super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                            .
                            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_infohashes_sample).samples.
                           super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                           .
                           super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x33333333))
    goto LAB_00352907;
  }
  pdVar3 = (this->m_infohashes_sample).samples.
           super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
           super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_infohashes_sample).samples.
      super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
      super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != pdVar3) {
    (this->m_infohashes_sample).samples.
    super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
    super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pdVar3;
  }
  std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::reserve
            ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *)
             &this->m_infohashes_sample,(long)(int)uVar16);
  p_Var13 = (this->m_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_map)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var13 != p_Var1) {
    uVar15 = (uint)(this->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    do {
      if (uVar16 == 0) {
        iVar14 = 2;
        uVar16 = 0;
      }
      else {
        uVar9 = uVar15 - 1;
        lVar12 = random((libtorrent *)(ulong)uVar15);
        iVar14 = 3;
        uVar15 = uVar9;
        if ((uint)lVar12 <= uVar16) {
          __args = p_Var13 + 1;
          __position._M_current =
               (this->m_infohashes_sample).samples.
               super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
               .
               super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->m_infohashes_sample).samples.
              super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
              .
              super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>::
            _M_realloc_insert<libtorrent::digest32<160l>const&>
                      ((vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>
                        *)&this->m_infohashes_sample,__position,(digest32<160L> *)__args);
          }
          else {
            ((__position._M_current)->m_number)._M_elems[4] = *(uint *)&p_Var13[1]._M_left;
            uVar8 = *(undefined4 *)&__args->field_0x4;
            p_Var6 = p_Var13[1]._M_parent;
            ((__position._M_current)->m_number)._M_elems[0] = __args->_M_color;
            ((__position._M_current)->m_number)._M_elems[1] = uVar8;
            *(_Base_ptr *)(((__position._M_current)->m_number)._M_elems + 2) = p_Var6;
            ppdVar2 = &(this->m_infohashes_sample).samples.
                       super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                       .
                       super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppdVar2 = *ppdVar2 + 1;
          }
          uVar16 = uVar16 - 1;
          iVar14 = 0;
        }
      }
    } while (((iVar14 == 3) || (iVar14 == 0)) &&
            (p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13),
            (_Rb_tree_header *)p_Var13 != p_Var1));
  }
  (this->m_infohashes_sample).created.__d.__r = (rep)tVar11.__d.__r;
LAB_00352907:
  pdVar3 = (this->m_infohashes_sample).samples.
           super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
           super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar4 = (this->m_infohashes_sample).samples.
           super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
           super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  key_01.len_ = 7;
  key_01.ptr_ = "samples";
  peVar10 = entry::operator[](item,key_01);
  v_00.m_len = (long)pdVar4 - (long)pdVar3;
  v_00.m_ptr = (char *)pdVar3;
  entry::operator=(peVar10,v_00);
  return (int)((ulong)((long)(this->m_infohashes_sample).samples.
                             super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                             .
                             super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_infohashes_sample).samples.
                            super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                            .
                            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x33333333;
}

Assistant:

int get_infohashes_sample(entry& item) override
		{
			item["interval"] = aux::clamp(m_settings.sample_infohashes_interval
				, 0, sample_infohashes_interval_max);
			item["num"] = int(m_map.size());

			refresh_infohashes_sample();

			aux::vector<sha1_hash> const& samples = m_infohashes_sample.samples;
			item["samples"] = span<char const>(
				reinterpret_cast<char const*>(samples.data()), static_cast<std::ptrdiff_t>(samples.size()) * 20);

			return m_infohashes_sample.count();
		}